

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

bool CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_Parse
               (ConstStringParam name,VisionFeaturePrint_Objects_ObjectsVersion *value)

{
  pointer size;
  char *size_00;
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  int int_value;
  VisionFeaturePrint_Objects_ObjectsVersion local_1c;
  
  size = (name->_M_dataplus)._M_p;
  size_00 = (char *)name->_M_string_length;
  if ((long)size_00 < 0) {
    google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)size_00,"string length exceeds max size");
  }
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = size_00;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)VisionFeaturePrint_Objects_ObjectsVersion_entries,(EnumEntry *)0x2,
                     (size_t)size,name_00,in_R9);
  if (bVar1) {
    *value = local_1c;
  }
  return bVar1;
}

Assistant:

bool VisionFeaturePrint_Objects_ObjectsVersion_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, VisionFeaturePrint_Objects_ObjectsVersion* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      VisionFeaturePrint_Objects_ObjectsVersion_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<VisionFeaturePrint_Objects_ObjectsVersion>(int_value);
  }
  return success;
}